

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_D3D_BREAKC(Context *ctx)

{
  char *pcVar1;
  char op [16];
  
  pcVar1 = get_D3D_comparison_string(ctx);
  snprintf(op,0x10,"break%s",pcVar1);
  emit_D3D_opcode_ss(ctx,op);
  return;
}

Assistant:

static void emit_D3D_BREAKC(Context *ctx)
{
    char op[16];
    snprintf(op, sizeof (op), "break%s", get_D3D_comparison_string(ctx));
    emit_D3D_opcode_ss(ctx, op);
}